

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::QAction(QAction *this,QActionPrivate *dd,QObject *parent)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  QObject *ptr;
  
  QObject::QObject(&this->super_QObject,&dd->super_QObjectPrivate,(QObject *)parent);
  *(undefined ***)this = &PTR_metaObject_007895b8;
  lVar1 = *(long *)&this->field_0x8;
  ptr = &QtPrivate::qobject_cast_helper<QActionGroup*,QObject>(parent)->super_QObject;
  this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x78);
  QWeakPointer<QObject>::assign<QObject>(this_00,ptr);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    QActionGroup::addAction(*(QActionGroup **)(lVar1 + 0x80),this);
    return;
  }
  return;
}

Assistant:

QAction::QAction(QActionPrivate &dd, QObject *parent)
    : QObject(dd, parent)
{
    Q_D(QAction);
    d->group = qobject_cast<QActionGroup *>(parent);
    if (d->group)
        d->group->addAction(this);
}